

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::rl_e(CPU *this)

{
  CPU *this_local;
  
  rl_r8(this,&this->regs->e);
  return 2;
}

Assistant:

int CPU::rl_e() {
    rl_r8(regs.e);
    return 2;
}